

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::
get95percentConfidenceInterval
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Accumulator<std::vector<double,_std::allocator<double>_>_> *this)

{
  size_t sVar1;
  pointer pdVar2;
  long lVar3;
  vector<double,_std::allocator<double>_> stdDev;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)(this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_28);
  getStdDev((vector<double,_std::allocator<double>_> *)&local_28,this);
  sVar1 = this->Count_;
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar3 = 0;
      (long)local_28._M_impl.super__Vector_impl_data._M_finish -
      (long)local_28._M_impl.super__Vector_impl_data._M_start >> 3 != lVar3; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] =
         (local_28._M_impl.super__Vector_impl_data._M_start[lVar3] * 1.96) /
         SQRT(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> get95percentConfidenceInterval() const {
      std::vector<RealType> ci(Avg_.size());
      std::vector<RealType> stdDev = this->getStdDev();

      for (std::size_t i = 0; i < stdDev.size(); i++) {
        ci[i] = 1.960 * stdDev[i] / std::sqrt(static_cast<RealType>(Count_));
      }

      return ci;
    }